

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

EncodingResult<kj::String> *
kj::decodeUtf16(EncodingResult<kj::String> *__return_storage_ptr__,ArrayPtr<const_char16_t> utf16)

{
  ulong uVar1;
  ulong index;
  size_t sVar2;
  char16_t *pcVar3;
  bool bVar4;
  Array<char> local_d8;
  String local_c0;
  int local_a8;
  byte local_a3;
  byte local_a2;
  byte local_a1;
  initializer_list<char> local_a0;
  byte local_8c;
  byte local_8b;
  byte local_8a;
  byte local_89;
  initializer_list<char> local_88;
  uint local_78;
  char16_t local_74;
  byte local_72;
  byte local_71;
  char32_t u32;
  char16_t u2;
  size_type local_68;
  char16_t local_5e [4];
  char16_t u;
  ulong local_50;
  size_t i;
  undefined1 local_40 [7];
  bool hadErrors;
  Vector<char> result;
  ArrayPtr<const_char16_t> utf16_local;
  
  result.builder.disposer = (ArrayDisposer *)utf16.ptr;
  sVar2 = ArrayPtr<const_char16_t>::size((ArrayPtr<const_char16_t> *)&result.builder.disposer);
  Vector<char>::Vector((Vector<char> *)local_40,sVar2 + 1);
  i._7_1_ = 0;
  local_50 = 0;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          uVar1 = local_50;
          sVar2 = ArrayPtr<const_char16_t>::size
                            ((ArrayPtr<const_char16_t> *)&result.builder.disposer);
          index = local_50;
          if (sVar2 <= uVar1) {
            local_a8 = 0;
            Vector<char>::add<int>((Vector<char> *)local_40,&local_a8);
            Vector<char>::releaseAsArray(&local_d8,(Vector<char> *)local_40);
            String::String(&local_c0,&local_d8);
            EncodingResult<kj::String>::EncodingResult
                      (__return_storage_ptr__,&local_c0,(bool)(i._7_1_ & 1));
            String::~String(&local_c0);
            Array<char>::~Array(&local_d8);
            Vector<char>::~Vector((Vector<char> *)local_40);
            return __return_storage_ptr__;
          }
          local_50 = local_50 + 1;
          pcVar3 = ArrayPtr<const_char16_t>::operator[]
                             ((ArrayPtr<const_char16_t> *)&result.builder.disposer,index);
          uVar1 = local_50;
          local_5e[0] = *pcVar3;
          if (0x7f < (ushort)local_5e[0]) break;
          Vector<char>::add<char16_t&>((Vector<char> *)local_40,local_5e);
        }
        if (0x7ff < (ushort)local_5e[0]) break;
        local_72 = (byte)((ushort)local_5e[0] >> 6) | 0xc0;
        local_71 = (byte)local_5e[0] & 0x3f | 0x80;
        _u32 = &local_72;
        local_68 = 2;
        Vector<char>::addAll<std::initializer_list<char>>
                  ((Vector<char> *)local_40,(initializer_list<char> *)&u32);
      }
      if ((local_5e[0] & 0xf800U) == 0xd800) break;
LAB_003da026:
      local_a3 = (byte)((ushort)local_5e[0] >> 0xc) | 0xe0;
      local_a2 = (byte)((ushort)local_5e[0] >> 6) & 0x3f | 0x80;
      local_a1 = (byte)local_5e[0] & 0x3f | 0x80;
      local_a0._M_array = (iterator)&local_a3;
      local_a0._M_len = 3;
      Vector<char>::addAll<std::initializer_list<char>>((Vector<char> *)local_40,&local_a0);
    }
    sVar2 = ArrayPtr<const_char16_t>::size((ArrayPtr<const_char16_t> *)&result.builder.disposer);
    bVar4 = true;
    if ((uVar1 != sVar2) && (bVar4 = true, (local_5e[0] & 0x400U) == 0)) {
      pcVar3 = ArrayPtr<const_char16_t>::operator[]
                         ((ArrayPtr<const_char16_t> *)&result.builder.disposer,local_50);
      local_74 = *pcVar3;
      bVar4 = (local_74 & 0xfc00U) != 0xdc00;
    }
    if (bVar4) {
      i._7_1_ = 1;
      goto LAB_003da026;
    }
    local_50 = local_50 + 1;
    local_78 = ((ushort)local_5e[0] & 0x3ff) * 0x400 + 0x10000 + ((ushort)local_74 & 0x3ff);
    local_8c = (byte)(local_78 >> 0x12) | 0xf0;
    local_8b = (byte)(local_78 >> 0xc) & 0x3f | 0x80;
    local_8a = (byte)(local_78 >> 6) & 0x3f | 0x80;
    local_89 = (byte)local_78 & 0x3f | 0x80;
    local_88._M_array = (iterator)&local_8c;
    local_88._M_len = 4;
    Vector<char>::addAll<std::initializer_list<char>>((Vector<char> *)local_40,&local_88);
  } while( true );
}

Assistant:

EncodingResult<String> decodeUtf16(ArrayPtr<const char16_t> utf16) {
  Vector<char> result(utf16.size() + 1);
  bool hadErrors = false;

  size_t i = 0;
  while (i < utf16.size()) {
    char16_t u = utf16[i++];

    if (u < 0x80) {
      result.add(u);
      continue;
    } else if (u < 0x0800) {
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >>  6)       ) | 0xc0),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    } else if ((u & 0xf800) == 0xd800) {
      // surrogate pair
      char16_t u2;
      if (KJ_UNLIKELY(i == utf16.size()                         // missing second half
                   || (u & 0x0400) != 0                         // first half in wrong range
                   || ((u2 = utf16[i]) & 0xfc00) != 0xdc00)) {  // second half in wrong range
        hadErrors = true;
        goto threeByte;
      }
      ++i;

      char32_t u32 = (((u & 0x03ff) << 10) | (u2 & 0x03ff)) + 0x10000;
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u32 >> 18)       ) | 0xf0),
        static_cast<char>(((u32 >> 12) & 0x3f) | 0x80),
        static_cast<char>(((u32 >>  6) & 0x3f) | 0x80),
        static_cast<char>(((u32      ) & 0x3f) | 0x80)
      });
      continue;
    } else {
    threeByte:
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >> 12)       ) | 0xe0),
        static_cast<char>(((u >>  6) & 0x3f) | 0x80),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    }
  }

  result.add(0);
  return { String(result.releaseAsArray()), hadErrors };
}